

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

int google::protobuf::Fls64(uint64 n)

{
  ulong in_RDI;
  uint32 n32;
  int pos;
  undefined4 local_60;
  undefined4 local_5c;
  undefined8 local_8;
  
  local_5c = 0;
  local_8 = in_RDI;
  if (0xffffffff < in_RDI) {
    local_8 = in_RDI >> 0x20;
    local_5c = 0x20;
  }
  local_60 = (uint)local_8;
  if (0xffff < local_60) {
    local_60 = local_60 >> 0x10;
    local_5c = local_5c | 0x10;
  }
  if (0xff < local_60) {
    local_60 = local_60 >> 8;
    local_5c = local_5c | 8;
  }
  if (0xf < local_60) {
    local_60 = local_60 >> 4;
    local_5c = local_5c | 4;
  }
  return local_5c + ((uint)(0x3333333322221100 >> ((byte)(local_60 << 2) & 0x3f)) & 3);
}

Assistant:

static inline int Fls64(uint64 n) {
  GOOGLE_DCHECK_NE(0, n);
  int pos = 0;
  STEP(uint64, n, pos, 0x20);
  uint32 n32 = n;
  STEP(uint32, n32, pos, 0x10);
  STEP(uint32, n32, pos, 0x08);
  STEP(uint32, n32, pos, 0x04);
  return pos + ((PROTOBUF_ULONGLONG(0x3333333322221100) >> (n32 << 2)) & 0x3);
}